

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

void icu_63::set32x64Bits(uint32_t *table,int32_t start,int32_t limit)

{
  uint uVar1;
  int iVar2;
  uint32_t local_30;
  int32_t limitTrail;
  int32_t limitLead;
  uint32_t bits;
  int32_t trail;
  int32_t lead;
  int32_t limit_local;
  int32_t start_local;
  uint32_t *table_local;
  
  bits = start >> 6;
  limitLead = start & 0x3f;
  uVar1 = 1 << ((byte)bits & 0x1f);
  if (start + 1 == limit) {
    table[limitLead] = uVar1 | table[limitLead];
  }
  else {
    local_30 = limit >> 6;
    if (bits == local_30) {
      while (limitLead < (int)(limit & 0x3fU)) {
        table[limitLead] = uVar1 | table[limitLead];
        limitLead = limitLead + 1;
      }
    }
    else {
      if (limitLead != 0) {
        do {
          iVar2 = limitLead + 1;
          table[limitLead] = uVar1 | table[limitLead];
          limitLead = iVar2;
        } while (iVar2 < 0x40);
        bits = bits + 1;
      }
      if ((int)bits < (int)local_30) {
        limitTrail = (1 << ((byte)bits & 0x1f)) - 1U ^ 0xffffffff;
        if ((int)local_30 < 0x20) {
          limitTrail = (1 << ((byte)local_30 & 0x1f)) - 1U & limitTrail;
        }
        for (limitLead = 0; limitLead < 0x40; limitLead = limitLead + 1) {
          table[limitLead] = limitTrail | table[limitLead];
        }
      }
      if (local_30 == 0x20) {
        local_30 = 0x1f;
      }
      for (limitLead = 0; limitLead < (int)(limit & 0x3fU); limitLead = limitLead + 1) {
        table[limitLead] = 1 << ((byte)local_30 & 0x1f) | table[limitLead];
      }
    }
  }
  return;
}

Assistant:

static void set32x64Bits(uint32_t table[64], int32_t start, int32_t limit) {
    U_ASSERT(start<limit);
    U_ASSERT(limit<=0x800);

    int32_t lead=start>>6;  // Named for UTF-8 2-byte lead byte with upper 5 bits.
    int32_t trail=start&0x3f;  // Named for UTF-8 2-byte trail byte with lower 6 bits.

    // Set one bit indicating an all-one block.
    uint32_t bits=(uint32_t)1<<lead;
    if((start+1)==limit) {  // Single-character shortcut.
        table[trail]|=bits;
        return;
    }

    int32_t limitLead=limit>>6;
    int32_t limitTrail=limit&0x3f;

    if(lead==limitLead) {
        // Partial vertical bit column.
        while(trail<limitTrail) {
            table[trail++]|=bits;
        }
    } else {
        // Partial vertical bit column,
        // followed by a bit rectangle,
        // followed by another partial vertical bit column.
        if(trail>0) {
            do {
                table[trail++]|=bits;
            } while(trail<64);
            ++lead;
        }
        if(lead<limitLead) {
            bits=~(((unsigned)1<<lead)-1);
            if(limitLead<0x20) {
                bits&=((unsigned)1<<limitLead)-1;
            }
            for(trail=0; trail<64; ++trail) {
                table[trail]|=bits;
            }
        }
        // limit<=0x800. If limit==0x800 then limitLead=32 and limitTrail=0.
        // In that case, bits=1<<limitLead is undefined but the bits value
        // is not used because trail<limitTrail is already false.
        bits=(uint32_t)1<<((limitLead == 0x20) ? (limitLead - 1) : limitLead);
        for(trail=0; trail<limitTrail; ++trail) {
            table[trail]|=bits;
        }
    }
}